

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O3

MPP_RET hal_h265e_v541_wait(void *hal,HalEncTask *task)

{
  uint *puVar1;
  MPP_RET MVar2;
  
  puVar1 = *(uint **)((long)hal + 0x80);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) enter\n",(char *)0x0,0x7b3);
  }
  if ((task->flags).err == 0) {
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
    if (MVar2 != MPP_OK) {
      _mpp_log_l(2,"hal_h265e_v541","poll cmd failed %d status %d \n","hal_h265e_v541_wait",
                 (ulong)(uint)MVar2,(ulong)*puVar1);
    }
    if (((byte)hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v541","(%d) leave\n",(char *)0x0,0x7bd);
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v541","enc_task->flags.err %08x, return early","hal_h265e_v541_wait");
    MVar2 = MPP_NOK;
  }
  return MVar2;
}

Assistant:

MPP_RET hal_h265e_v541_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV541HalContext *ctx = (H265eV541HalContext *)hal;
    HalEncTask *enc_task = task;
    H265eV541IoctlOutputElem *elem = (H265eV541IoctlOutputElem *)ctx->reg_out;
    hal_h265e_enter();
    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }
    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d status %d \n", ret, elem->hw_status);

    hal_h265e_leave();
    return ret;
}